

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O3

MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_> *
deqp::egl::Image::createUnsupportedImageSource
          (MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           *__return_storage_ptr__,string *message,GLenum format)

{
  pointer pcVar1;
  ImageSource *pIVar2;
  
  pIVar2 = (ImageSource *)operator_new(0x30);
  pIVar2->_vptr_ImageSource = (_func_int **)&PTR__UnsupportedImageSource_003ef778;
  pIVar2[1]._vptr_ImageSource = (_func_int **)(pIVar2 + 3);
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pIVar2 + 1),pcVar1,pcVar1 + message->_M_string_length);
  *(GLenum *)&pIVar2[5]._vptr_ImageSource = format;
  (__return_storage_ptr__->
  super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  ).m_data.ptr = pIVar2;
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ImageSource> createUnsupportedImageSource (const string& message, GLenum format)
{
	return MovePtr<ImageSource>(new UnsupportedImageSource(message, format));
}